

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O2

void dumpDictKeys(object *dict)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  char *templ;
  int i;
  ulong uVar4;
  int iStack_30;
  
  if (dict == (object *)0x0) {
    templ = "Null dictionary oop passed!";
    iStack_30 = 0x76;
  }
  else {
    puVar2 = (uint *)dict[1].header;
    if (puVar2 != (uint *)0x0) {
      uVar1 = *puVar2;
      for (uVar4 = 0; uVar1 >> 2 != uVar4; uVar4 = uVar4 + 1) {
        puVar3 = *(uint **)(puVar2 + uVar4 * 2 + 4);
        if (puVar3 != (uint *)0x0) {
          printf("%.*s ",(ulong)(*puVar3 >> 2),puVar3 + 4);
        }
      }
      return;
    }
    templ = "Dictionary does not have any keys!";
    iStack_30 = 0x7c;
  }
  info_impl("dumpDictKeys",iStack_30,templ);
  return;
}

Assistant:

void dumpDictKeys(struct object *dict)
{
    struct object *keys;
    struct object *key;
    int numKeys = 0;

    if(!dict) {
        info("Null dictionary oop passed!");
        return;
    }

    keys = dict->data[keysInDictionary];
    if(!keys) {
        info("Dictionary does not have any keys!");
        return;
    }

    numKeys = SIZE(keys);

    for(int i=0; i<numKeys; i++) {
        struct byteObject *key = (struct byteObject *)keys->data[i];

        if(key) {
            printf("%.*s ", SIZE(key), bytePtr(key));
        }
    }
}